

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

int Gia_ManChoiceMinLevel_rec(Gia_Man_t *p,int iPivot,int fDiveIn,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  uint Entry;
  uint iPivot_00;
  uint uVar3;
  
  pObj = Gia_ManObj(p,iPivot);
  iVar1 = 0;
  if ((~*(uint *)pObj & 0x9fffffff) != 0) {
    iVar1 = Gia_ObjLevel(p,pObj);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjLevel(p,pObj);
      return iVar1;
    }
    if (fDiveIn != 0) {
      uVar3 = (uint)p->pReprs[iPivot] & 0xfffffff;
      if (((uVar3 != 0xfffffff) && (uVar3 != 0)) || (0 < p->pNexts[iPivot])) {
        iVar1 = Gia_ObjIsHead(p,uVar3);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x217,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        iVar1 = 1000000000;
        Entry = 0xffffffff;
        for (iPivot_00 = uVar3; 0 < (int)iPivot_00; iPivot_00 = p->pNexts[iPivot_00]) {
          iVar2 = Gia_ManChoiceMinLevel_rec(p,iPivot_00,0,vMap);
          if (iVar2 < iVar1) {
            Entry = iPivot_00;
          }
          if (iVar2 <= iVar1) {
            iVar1 = iVar2;
          }
        }
        if (0 < iVar1) {
          Vec_IntWriteEntry(vMap,uVar3,Entry);
          iVar2 = Gia_ObjIsHead(p,uVar3);
          if (iVar2 != 0) {
            for (; 0 < (int)uVar3; uVar3 = p->pNexts[uVar3]) {
              Gia_ObjSetLevelId(p,uVar3,iVar1);
            }
            return iVar1;
          }
          __assert_fail("Gia_ObjIsHead(p, iRepr)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x222,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
        }
        __assert_fail("LevMin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x220,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
      }
    }
    uVar3 = (uint)*(undefined8 *)pObj;
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pPivot)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                    ,0x226,"int Gia_ManChoiceMinLevel_rec(Gia_Man_t *, int, int, Vec_Int_t *)");
    }
    iVar2 = Gia_ManChoiceMinLevel_rec(p,iPivot - (uVar3 & 0x1fffffff),1,vMap);
    iVar1 = Gia_ManChoiceMinLevel_rec(p,iPivot - (*(uint *)&pObj->field_0x4 & 0x1fffffff),1,vMap);
    if (iVar1 < iVar2) {
      iVar1 = iVar2;
    }
    iVar1 = iVar1 + 1;
    iVar2 = Gia_ObjId(p,pObj);
    Gia_ObjSetLevelId(p,iVar2,iVar1);
  }
  return iVar1;
}

Assistant:

int Gia_ManChoiceMinLevel_rec( Gia_Man_t * p, int iPivot, int fDiveIn, Vec_Int_t * vMap )
{
    int Level0, Level1, LevelMax;
    Gia_Obj_t * pPivot = Gia_ManObj( p, iPivot );
    if ( Gia_ObjIsCi(pPivot) )
        return 0;
    if ( Gia_ObjLevel(p, pPivot) )
        return Gia_ObjLevel(p, pPivot);
    if ( fDiveIn && Gia_ObjIsClass(p, iPivot) )
    {
        int iObj, ObjMin = -1, iRepr = Gia_ObjRepr(p, iPivot), LevMin = ABC_INFINITY;
        Gia_ClassForEachObj( p, iRepr, iObj )
        {
            int LevCur = Gia_ManChoiceMinLevel_rec( p, iObj, 0, vMap );
            if ( LevMin > LevCur )
            {
                LevMin = LevCur;
                ObjMin = iObj;
            }
        }
        assert( LevMin > 0 );
        Vec_IntWriteEntry( vMap, iRepr, ObjMin );
        Gia_ClassForEachObj( p, iRepr, iObj )
            Gia_ObjSetLevelId( p, iObj, LevMin );
        return LevMin;
    }
    assert( Gia_ObjIsAnd(pPivot) );
    Level0 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId0(pPivot, iPivot), 1, vMap );
    Level1 = Gia_ManChoiceMinLevel_rec( p, Gia_ObjFaninId1(pPivot, iPivot), 1, vMap );
    LevelMax = 1 + Abc_MaxInt(Level0, Level1);
    Gia_ObjSetLevel( p, pPivot, LevelMax );
    return LevelMax;
}